

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O2

void __thiscall MT32Emu::LA32WaveGenerator::advancePosition(LA32WaveGenerator *this)

{
  Bit32u BVar1;
  Bit32u resonanceWaveLengthFactor;
  LA32WaveGenerator *this_00;
  
  this_00 = this;
  BVar1 = getSampleStep(this);
  this->wavePosition = BVar1 + this->wavePosition & 0xfffff;
  BVar1 = 0;
  if (0x2000000 < this->cutoffVal) {
    BVar1 = this->cutoffVal + 0xfe000000 >> 10;
  }
  resonanceWaveLengthFactor = getResonanceWaveLengthFactor(this_00,BVar1);
  BVar1 = getHighLinearLength(this,BVar1);
  computePositions(this,BVar1,(resonanceWaveLengthFactor * 0x100 - BVar1) - 0x100000,
                   resonanceWaveLengthFactor);
  this->resonancePhase =
       (this->resonanceSinePosition >> 0x12) + (uint)(2 < (int)this->phase) * 2 &
       NEGATIVE_RISING_RESONANCE_SINE_SEGMENT;
  return;
}

Assistant:

void LA32WaveGenerator::advancePosition() {
	wavePosition += getSampleStep();
	wavePosition %= 4 * SINE_SEGMENT_RELATIVE_LENGTH;

	Bit32u effectiveCutoffValue = (cutoffVal > MIDDLE_CUTOFF_VALUE) ? (cutoffVal - MIDDLE_CUTOFF_VALUE) >> 10 : 0;
	Bit32u resonanceWaveLengthFactor = getResonanceWaveLengthFactor(effectiveCutoffValue);
	Bit32u highLinearLength = getHighLinearLength(effectiveCutoffValue);
	Bit32u lowLinearLength = (resonanceWaveLengthFactor << 8) - 4 * SINE_SEGMENT_RELATIVE_LENGTH - highLinearLength;
	computePositions(highLinearLength, lowLinearLength, resonanceWaveLengthFactor);

	resonancePhase = ResonancePhase(((resonanceSinePosition >> 18) + (phase > POSITIVE_FALLING_SINE_SEGMENT ? 2 : 0)) & 3);
}